

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall soplex::SLUFactor<double>::SLUFactor(SLUFactor<double> *this)

{
  int iVar1;
  Timer *pTVar2;
  shared_ptr<soplex::Tolerances> local_68;
  shared_ptr<soplex::Tolerances> local_58;
  shared_ptr<soplex::Tolerances> local_48;
  
  (this->super_SLinSolver<double>).spxout = (SPxOut *)0x0;
  (this->super_CLUFactor<double>).l.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_CLUFactor<double>).l.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_CLUFactor<double>).l.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_CLUFactor<double>).l.rval.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_CLUFactor<double>).l.rval.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_CLUFactor<double>).l.rval.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_CLUFactor<double>).diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_CLUFactor<double>).diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_CLUFactor<double>).diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_CLUFactor<double>).u.row.val.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_CLUFactor<double>).u.row.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_CLUFactor<double>).u.row.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (pointer)0x0;
  (this->super_CLUFactor<double>).u.col.val.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_CLUFactor<double>).u.col.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_CLUFactor<double>).u.col.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (pointer)0x0;
  (this->super_CLUFactor<double>).temp.pivots.next = (Pring *)0x0;
  (this->super_CLUFactor<double>).temp.pivots.prev = (Pring *)0x0;
  (this->super_CLUFactor<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_CLUFactor<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_CLUFactor<double>).temp.s_mark = (int *)0x0;
  (this->super_CLUFactor<double>).temp.s_max.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_CLUFactor<double>).temp.s_max.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_CLUFactor<double>).temp.s_max.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_CLUFactor<double>).temp.s_max.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&(this->super_CLUFactor<double>).temp.s_cact + 4) = 0;
  (this->super_CLUFactor<double>).temp.pivots.mkwtz = -1;
  (this->super_CLUFactor<double>).temp.pivots.idx = -1;
  (this->super_CLUFactor<double>).temp.pivots.pos = -1;
  (this->super_CLUFactor<double>).temp.pivot_row = (Pring *)0x0;
  (this->super_CLUFactor<double>).temp.pivot_rowNZ = (Pring *)0x0;
  (this->super_CLUFactor<double>).temp.pivot_col = (Pring *)0x0;
  (this->super_CLUFactor<double>).temp.pivot_colNZ = (Pring *)0x0;
  (this->super_SLinSolver<double>)._vptr_SLinSolver = (_func_int **)&PTR_getName_0069e310;
  VectorBase<double>::VectorBase(&this->vec,1);
  local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SSVectorBase<double>::SSVectorBase(&this->ssvec,1,&local_48);
  if (local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this->usetup = false;
  this->uptype = FOREST_TOMLIN;
  local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SSVectorBase<double>::SSVectorBase(&this->eta,1,&local_58);
  if (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SSVectorBase<double>::SSVectorBase(&this->forest,1,&local_68);
  if (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this->minThreshold = 0.01;
  this->timerType = USER_TIME;
  (this->super_CLUFactor<double>).u.row.elem = (Dring *)0x0;
  (this->super_CLUFactor<double>).u.col.elem = (Dring *)0x0;
  (this->super_CLUFactor<double>).u.col.idx = (int *)0x0;
  (this->super_CLUFactor<double>).l.idx = (int *)0x0;
  (this->super_CLUFactor<double>).thedim = 0;
  (this->super_CLUFactor<double>).nzCnt = 0;
  (this->super_CLUFactor<double>).row.orig = (int *)0x0;
  (this->super_CLUFactor<double>).row.perm = (int *)0x0;
  (this->super_CLUFactor<double>).col.orig = (int *)0x0;
  (this->super_CLUFactor<double>).col.perm = (int *)0x0;
  (this->super_CLUFactor<double>).l.start = (int *)0x0;
  (this->super_CLUFactor<double>).l.row = (int *)0x0;
  (this->super_CLUFactor<double>).l.ridx = (int *)0x0;
  (this->super_CLUFactor<double>).l.rbeg = (int *)0x0;
  (this->super_CLUFactor<double>).l.rorig = (int *)0x0;
  (this->super_CLUFactor<double>).l.rperm = (int *)0x0;
  (this->super_CLUFactor<double>).u.row.idx = (int *)0x0;
  (this->super_CLUFactor<double>).u.row.start = (int *)0x0;
  (this->super_CLUFactor<double>).u.row.len = (int *)0x0;
  (this->super_CLUFactor<double>).u.row.max = (int *)0x0;
  (this->super_CLUFactor<double>).u.col.start = (int *)0x0;
  (this->super_CLUFactor<double>).u.col.len = (int *)0x0;
  (this->super_CLUFactor<double>).u.col.max = (int *)0x0;
  pTVar2 = TimerFactory::createTimer(USER_TIME);
  this->solveTime = pTVar2;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  (this->super_CLUFactor<double>).factorTime = pTVar2;
  spx_alloc<int*>(&(this->super_CLUFactor<double>).row.perm,(this->super_CLUFactor<double>).thedim);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).row.orig,(this->super_CLUFactor<double>).thedim);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).col.perm,(this->super_CLUFactor<double>).thedim);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).col.orig,(this->super_CLUFactor<double>).thedim);
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_CLUFactor<double>).diag,(long)(this->super_CLUFactor<double>).thedim);
  (this->super_CLUFactor<double>).work =
       (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->super_CLUFactor<double>).u.row.size = 1;
  (this->super_CLUFactor<double>).u.row.used = 0;
  spx_alloc<soplex::CLUFactor<double>::Dring*>
            (&(this->super_CLUFactor<double>).u.row.elem,(this->super_CLUFactor<double>).thedim);
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_CLUFactor<double>).u.row.val,
             (long)(this->super_CLUFactor<double>).u.row.size);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.row.idx,
                  (this->super_CLUFactor<double>).u.row.size);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.row.start,
                  (this->super_CLUFactor<double>).thedim + 1);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.row.len,
                  (this->super_CLUFactor<double>).thedim + 1);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.row.max,
                  (this->super_CLUFactor<double>).thedim + 1);
  iVar1 = (this->super_CLUFactor<double>).thedim;
  (this->super_CLUFactor<double>).u.row.list.idx = iVar1;
  (this->super_CLUFactor<double>).u.row.start[iVar1] = 0;
  (this->super_CLUFactor<double>).u.row.max[(this->super_CLUFactor<double>).thedim] = 0;
  (this->super_CLUFactor<double>).u.row.len[(this->super_CLUFactor<double>).thedim] = 0;
  (this->super_CLUFactor<double>).u.col.size = 1;
  (this->super_CLUFactor<double>).u.col.used = 0;
  spx_alloc<soplex::CLUFactor<double>::Dring*>
            (&(this->super_CLUFactor<double>).u.col.elem,(this->super_CLUFactor<double>).thedim);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.col.idx,
                  (this->super_CLUFactor<double>).u.col.size);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.col.start,
                  (this->super_CLUFactor<double>).thedim + 1);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.col.len,
                  (this->super_CLUFactor<double>).thedim + 1);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).u.col.max,
                  (this->super_CLUFactor<double>).thedim + 1);
  iVar1 = (this->super_CLUFactor<double>).thedim;
  (this->super_CLUFactor<double>).u.col.list.idx = iVar1;
  (this->super_CLUFactor<double>).u.col.start[iVar1] = 0;
  (this->super_CLUFactor<double>).u.col.max[(this->super_CLUFactor<double>).thedim] = 0;
  (this->super_CLUFactor<double>).u.col.len[(this->super_CLUFactor<double>).thedim] = 0;
  (this->super_CLUFactor<double>).l.size = 1;
  std::vector<double,_std::allocator<double>_>::resize(&(this->super_CLUFactor<double>).l.val,1);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).l.idx,(this->super_CLUFactor<double>).l.size);
  (this->super_CLUFactor<double>).l.startSize = 1;
  (this->super_CLUFactor<double>).l.firstUpdate = 0;
  (this->super_CLUFactor<double>).l.firstUnused = 0;
  spx_alloc<int*>(&(this->super_CLUFactor<double>).l.start,1);
  spx_alloc<int*>(&(this->super_CLUFactor<double>).l.row,(this->super_CLUFactor<double>).l.startSize
                 );
  (this->super_CLUFactor<double>).l.rorig = (int *)0x0;
  (this->super_CLUFactor<double>).l.rperm = (int *)0x0;
  (this->super_CLUFactor<double>).l.ridx = (int *)0x0;
  (this->super_CLUFactor<double>).l.rbeg = (int *)0x0;
  clear(this);
  (this->super_CLUFactor<double>).factorCount = 0;
  (this->super_CLUFactor<double>).hugeValues = 0;
  this->solveCount = 0;
  return;
}

Assistant:

SLUFactor<R>::SLUFactor()
   : vec(1)
   , ssvec(1)
   , usetup(false)
   , uptype(FOREST_TOMLIN)
   , eta(1)
   , forest(1)
   , minThreshold(0.01)
   , timerType(Timer::USER_TIME)
{
   this->row.perm    = nullptr;
   this->row.orig    = nullptr;
   this->col.perm    = nullptr;
   this->col.orig    = nullptr;
   this->u.row.elem  = nullptr;
   this->u.row.idx   = nullptr;
   this->u.row.start = nullptr;
   this->u.row.len   = nullptr;
   this->u.row.max   = nullptr;
   this->u.col.elem  = nullptr;
   this->u.col.idx   = nullptr;
   this->u.col.start = nullptr;
   this->u.col.len   = nullptr;
   this->u.col.max   = nullptr;
   this->l.idx       = nullptr;
   this->l.start     = nullptr;
   this->l.row       = nullptr;
   this->l.ridx      = nullptr;
   this->l.rbeg      = nullptr;
   this->l.rorig     = nullptr;
   this->l.rperm     = nullptr;

   this->nzCnt  = 0;
   this->thedim = 0;

   try
   {
      solveTime = TimerFactory::createTimer(timerType);
      this->factorTime = TimerFactory::createTimer(timerType);
      spx_alloc(this->row.perm, this->thedim);
      spx_alloc(this->row.orig, this->thedim);
      spx_alloc(this->col.perm, this->thedim);
      spx_alloc(this->col.orig, this->thedim);

      this->diag.resize(this->thedim);

      this->work = vec.get_ptr();

      this->u.row.size = 1;
      this->u.row.used = 0;
      spx_alloc(this->u.row.elem,  this->thedim);
      this->u.row.val.resize(this->u.row.size);
      spx_alloc(this->u.row.idx,   this->u.row.size);
      spx_alloc(this->u.row.start, this->thedim + 1);
      spx_alloc(this->u.row.len,   this->thedim + 1);
      spx_alloc(this->u.row.max,   this->thedim + 1);

      this->u.row.list.idx      = this->thedim;
      this->u.row.start[this->thedim] = 0;
      this->u.row.max  [this->thedim] = 0;
      this->u.row.len  [this->thedim] = 0;

      this->u.col.size = 1;
      this->u.col.used = 0;
      spx_alloc(this->u.col.elem,  this->thedim);
      spx_alloc(this->u.col.idx,   this->u.col.size);
      spx_alloc(this->u.col.start, this->thedim + 1);
      spx_alloc(this->u.col.len,   this->thedim + 1);
      spx_alloc(this->u.col.max,   this->thedim + 1);

      this->u.col.list.idx      = this->thedim;
      this->u.col.start[this->thedim] = 0;
      this->u.col.max[this->thedim]   = 0;
      this->u.col.len[this->thedim]   = 0;

      this->l.size = 1;

      this->l.val.resize(this->l.size);
      spx_alloc(this->l.idx, this->l.size);

      this->l.startSize   = 1;
      this->l.firstUpdate = 0;
      this->l.firstUnused = 0;

      spx_alloc(this->l.start, this->l.startSize);
      spx_alloc(this->l.row,   this->l.startSize);
   }
   catch(const SPxMemoryException& x)
   {
      freeAll();
      throw x;
   }

   this->l.ridx  = nullptr;
   this->l.rbeg  = nullptr;
   this->l.rorig = nullptr;
   this->l.rperm = nullptr;

   SLUFactor<R>::clear(); // clear() is virtual

   this->factorCount = 0;
   this->hugeValues = 0;
   solveCount  = 0;
   assert(this->row.perm != nullptr);

   assert(this->row.orig != nullptr);
   assert(this->col.perm != nullptr);
   assert(this->col.orig != nullptr);

   assert(this->u.row.elem  != nullptr);
   assert(this->u.row.idx   != nullptr);
   assert(this->u.row.start != nullptr);
   assert(this->u.row.len   != nullptr);
   assert(this->u.row.max   != nullptr);

   assert(this->u.col.elem  != nullptr);
   assert(this->u.col.idx   != nullptr);
   assert(this->u.col.start != nullptr);
   assert(this->u.col.len   != nullptr);
   assert(this->u.col.max   != nullptr);

   assert(this->l.idx   != nullptr);
   assert(this->l.start != nullptr);
   assert(this->l.row   != nullptr);

   assert(SLUFactor<R>::isConsistent());
}